

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *attr,
          string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  optional<unsigned_int> oVar3;
  tinyusdz *this_00;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n_01;
  byte bVar8;
  Animatable<std::array<float,_2UL>_> *v;
  AttrMetas *pAVar9;
  bool bVar10;
  stringstream ss;
  string local_210;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *local_1f0;
  AttrMetas *local_1e8;
  tinyusdz *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  v = (Animatable<std::array<float,_2UL>_> *)((ulong)name & 0xffffffff);
  local_1f0 = attr;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[600];
  if ((((tVar2 != (tinyusdz)0x0) || (this[0x220] != (tinyusdz)0x0)) ||
      (*(long *)(this + 0x210) != *(long *)(this + 0x208))) || (this[0x290] == (tinyusdz)0x1)) {
    local_1e0 = this + 0x260;
    if (this[0x220] != (tinyusdz)0x0) {
      local_1e0 = this + 0x228;
    }
    lVar7 = *(long *)(this + 0x210);
    if ((local_1e0[9] == (tinyusdz)0x0) && (local_1e0[8] == (tinyusdz)0x0)) {
      bVar5 = *(long *)(local_1e0 + 0x10) != *(long *)(local_1e0 + 0x18);
    }
    else {
      bVar5 = false;
    }
    if (lVar7 == *(long *)(this + 0x208)) {
      bVar8 = (byte)this[0x220] ^ 1 | (byte)tVar2;
    }
    else {
      bVar8 = 0;
    }
    bVar10 = lVar7 != *(long *)(this + 0x208);
    local_1e8 = (AttrMetas *)this;
    bVar4 = AttrMetas::authored((AttrMetas *)this);
    this_00 = local_1e0;
    indent_00 = (uint32_t)lVar7;
    n_01 = n;
    if (((bVar10 | bVar5) & ~(bVar4 | bVar8) & (byte)tVar2) == 0) {
      if (tVar2 == (tinyusdz)0x0) {
        pprint::Indent_abi_cxx11_(&local_210,(pprint *)v,n);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        paVar1 = &local_210.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
        local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
        local_210._M_string_length = 6;
        local_210.field_2._M_local_buf[6] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar1;
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,paVar1->_M_local_buf,6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)(local_1f0->_metas).interpolation,
                   (long)(local_1f0->_metas).elementSize);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
        print_animatable_default<std::array<float,2ul>>(&local_210,this_00,v,indent_00);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        pAVar9 = local_1e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
          pAVar9 = local_1e8;
        }
      }
      else {
        pprint::Indent_abi_cxx11_(&local_210,(pprint *)v,n);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        pAVar9 = local_1e8;
        paVar1 = &local_210.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
        local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
        local_210._M_string_length = 6;
        local_210.field_2._M_local_buf[6] = '\0';
        local_210._M_dataplus._M_p = (pointer)paVar1;
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,paVar1->_M_local_buf,6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)(local_1f0->_metas).interpolation,
                   (long)(local_1f0->_metas).elementSize);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != paVar1) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
      bVar5 = AttrMetas::authored(pAVar9);
      if (bVar5) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
        print_attr_metas_abi_cxx11_
                  (&local_210,(tinyusdz *)pAVar9,(AttrMeta *)(ulong)((int)name + 1),indent_00);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)v,n_00);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,
                          CONCAT17(local_210.field_2._M_local_buf[7],
                                   CONCAT16(local_210.field_2._M_local_buf[6],
                                            CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                     local_210.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    if (this_00[0x28] == (tinyusdz)0x1) {
      TypedTimeSamples<std::array<float,_2UL>_>::update
                ((TypedTimeSamples<std::array<float,_2UL>_> *)(this_00 + 0x10));
      n_01 = extraout_EDX_00;
    }
    pAVar9 = local_1e8;
    if (*(long *)(this_00 + 0x18) != *(long *)(this_00 + 0x10)) {
      pprint::Indent_abi_cxx11_(&local_210,(pprint *)v,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
      local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
      local_210._M_string_length = 6;
      local_210.field_2._M_local_buf[6] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(char *)(local_1f0->_metas).interpolation,
                 (long)(local_1f0->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
      print_animatable_timesamples<std::array<float,2ul>>(&local_210,local_1e0,v,indent_00);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX_01;
    }
    oVar3.has_value_ = pAVar9[1].interpolation.has_value_;
    oVar3._1_3_ = *(undefined3 *)&pAVar9[1].interpolation.field_0x1;
    oVar3.contained = *(storage_t<unsigned_int> *)&pAVar9[1].interpolation.contained;
    if (pAVar9[1].elementSize != oVar3) {
      pprint::Indent_abi_cxx11_(&local_210,(pprint *)v,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      paVar1 = &local_210.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_210.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
      local_210.field_2._M_allocated_capacity._4_2_ = 0x3274;
      local_210._M_string_length = 6;
      local_210.field_2._M_local_buf[6] = '\0';
      local_210._M_dataplus._M_p = (pointer)paVar1;
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(char *)(local_1f0->_metas).interpolation,
                 (long)(local_1f0->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT17(local_210.field_2._M_local_buf[7],
                                 CONCAT16(local_210.field_2._M_local_buf[6],
                                          CONCAT24(local_210.field_2._M_allocated_capacity._4_2_,
                                                   local_210.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      lVar7 = ((long)pAVar9[1].elementSize - (long)pAVar9[1].interpolation >> 4) *
              0x4ec4ec4ec4ec4ec5;
      if (lVar7 == 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar7 == 1) {
        ::std::operator<<(local_1a8,(Path *)pAVar9[1].interpolation);
      }
      else {
        ::std::operator<<(local_1a8,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(pAVar9 + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(
    const TypedAttributeWithFallback<Animatable<T>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    const auto &v = attr.get_value();

    bool is_connection = attr.is_connection();
    bool is_timesamples = v.is_timesamples();
    bool has_value = attr.has_value();
    bool is_value_empty = attr.is_value_empty();

    DCOUT("name " << name);
    DCOUT("is_value_empty " << attr.is_value_empty());
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("has_value " << has_value);

    if (attr.metas().authored() || has_value || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      if (has_value) {
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
        ss << " = " << print_animatable_default(v, indent);

      } else { // attr.is_value_empty()
        // declare only
        ss << pprint::Indent(indent);
        ss << value::TypeTraits<T>::type_name() << " " << name;
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (v.has_timesamples()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = " << print_animatable_timesamples(v, indent);
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  }

  return ss.str();
}